

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStringBuilder.cpp
# Opt level: O0

void __thiscall
Js::BufferStringBuilder::WritableString::SetContent
          (WritableString *this,char16 *prefix,charcount_t cchPrefix,char16 *content,
          charcount_t cchContent,char16 *suffix,charcount_t cchSuffix)

{
  charcount_t local_44;
  char16 *pcStack_40;
  charcount_t cchRemain;
  char16 *dst;
  char16 *suffix_local;
  char16 *pcStack_28;
  charcount_t cchContent_local;
  char16 *content_local;
  char16 *pcStack_18;
  charcount_t cchPrefix_local;
  char16 *prefix_local;
  WritableString *this_local;
  
  dst = suffix;
  suffix_local._4_4_ = cchContent;
  pcStack_28 = content;
  content_local._4_4_ = cchPrefix;
  pcStack_18 = prefix;
  prefix_local = (char16 *)this;
  pcStack_40 = GetWritableBuffer(this);
  local_44 = JavascriptString::GetLength(&this->super_JavascriptString);
  pcStack_40 = SafeCopyAndAdvancePtr(pcStack_40,&local_44,pcStack_18,content_local._4_4_);
  pcStack_40 = SafeCopyAndAdvancePtr(pcStack_40,&local_44,pcStack_28,suffix_local._4_4_);
  SafeCopyAndAdvancePtr(pcStack_40,&local_44,dst,cchSuffix);
  return;
}

Assistant:

void BufferStringBuilder::WritableString::SetContent(
            const char16* prefix, charcount_t cchPrefix,
            const char16* content, charcount_t cchContent,
            const char16* suffix, charcount_t cchSuffix)
    {
        char16* dst = GetWritableBuffer();

        charcount_t cchRemain = GetLength();
        dst = SafeCopyAndAdvancePtr(dst, cchRemain, prefix, cchPrefix);
        dst = SafeCopyAndAdvancePtr(dst, cchRemain, content, cchContent);
        (void)SafeCopyAndAdvancePtr(dst, cchRemain, suffix, cchSuffix);
    }